

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O0

HPDF_STATUS HPDF_SaveToFile(HPDF_Doc pdf,char *file_name)

{
  HPDF_BOOL HVar1;
  HPDF_Stream stream_00;
  HPDF_Stream_conflict stream;
  char *file_name_local;
  HPDF_Doc pdf_local;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 == 0) {
    pdf_local = (HPDF_Doc)0x1025;
  }
  else {
    stream_00 = HPDF_FileWriter_New(pdf->mmgr,file_name);
    if (stream_00 == (HPDF_Stream)0x0) {
      pdf_local = (HPDF_Doc)HPDF_CheckError(&pdf->error);
    }
    else {
      InternalSaveToStream(pdf,stream_00);
      HPDF_Stream_Free(stream_00);
      pdf_local = (HPDF_Doc)HPDF_CheckError(&pdf->error);
    }
  }
  return (HPDF_STATUS)pdf_local;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_SaveToFile  (HPDF_Doc     pdf,
                  const char  *file_name)
{
    HPDF_Stream stream;

    HPDF_PTRACE ((" HPDF_SaveToFile\n"));

    if (!HPDF_HasDoc (pdf))
        return HPDF_INVALID_DOCUMENT;

    stream = HPDF_FileWriter_New (pdf->mmgr, file_name);
    if (!stream)
        return HPDF_CheckError (&pdf->error);

    InternalSaveToStream (pdf, stream);

    HPDF_Stream_Free (stream);

    return HPDF_CheckError (&pdf->error);
}